

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::initializePath(XMLUri *this,XMLCh *uriSpec)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MalformedURLException *this_00;
  XMLCh XVar6;
  XMLSize_t XVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  XMLSize_t XVar11;
  ulong uVar12;
  XMLCh value1 [2];
  XMLCh local_40;
  undefined2 uStack_3e;
  XMLCh local_3c;
  undefined2 local_3a;
  long local_38;
  
  if (uriSpec == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x341,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
LAB_00253c0c:
    __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  lVar5 = 0;
  do {
    psVar1 = (short *)((long)uriSpec + lVar5);
    lVar5 = lVar5 + 2;
  } while (*psVar1 != 0);
  uVar10 = lVar5 >> 1;
  uVar4 = uVar10 - 1;
  if (uVar4 == 0) {
    XVar6 = L'\0';
    uVar9 = 0;
  }
  else if ((this->fScheme == (XMLCh *)0x0) || (*uriSpec == L'/')) {
    XVar7 = uVar4 + (uVar4 == 0);
    XVar11 = 0;
    do {
      XVar6 = uriSpec[XVar11];
      if (XVar6 == L'%') {
        if (uVar4 <= XVar11 + 2) {
          uStack_3e = 0;
          local_3c = L'\0';
          memcpy(&local_40,uriSpec + XVar11,(ulong)(XVar11 + 1 < uVar4) * 2 + 2);
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x367,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                     &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
        bVar2 = XMLString::isHex(uriSpec[XVar11 + 1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[XVar11 + 2]), !bVar2)) {
          local_3c = uriSpec[XVar11 + 2];
          local_40 = (XMLCh)*(undefined4 *)(uriSpec + XVar11);
          uStack_3e = (undefined2)((uint)*(undefined4 *)(uriSpec + XVar11) >> 0x10);
          local_3a = 0;
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x372,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                     &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
      }
      else {
        uVar9 = XVar11;
        if ((XVar6 == L'#') || (XVar6 == L'?')) break;
        bVar2 = XMLString::isAlphaNum(XVar6);
        if ((!bVar2) &&
           ((iVar3 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,XVar6), iVar3 == -1 &&
            (iVar3 = XMLString::indexOf((XMLCh *)PATH_CHARACTERS,XVar6), iVar3 == -1)))) {
          uStack_3e = 0;
          local_40 = XVar6;
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x37f,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,&local_40,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
      }
      XVar11 = XVar11 + 1;
      uVar9 = XVar7;
    } while (XVar7 != XVar11);
  }
  else {
    uVar12 = 0;
    do {
      XVar6 = uriSpec[uVar12];
      if (XVar6 == L'%') {
        if (uVar4 <= uVar12 + 2) {
          uStack_3e = 0;
          local_3c = L'\0';
          memcpy(&local_40,uriSpec + uVar12,(ulong)(uVar12 + 1 < uVar4) * 2 + 2);
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x39e,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                     &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
        bVar2 = XMLString::isHex(uriSpec[uVar12 + 1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[uVar12 + 2]), !bVar2)) {
          local_3c = uriSpec[uVar12 + 2];
          local_40 = (XMLCh)*(undefined4 *)(uriSpec + uVar12);
          uStack_3e = (undefined2)((uint)*(undefined4 *)(uriSpec + uVar12) >> 0x10);
          local_3a = 0;
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3a9,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                     &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
      }
      else {
        uVar9 = uVar12;
        if ((XVar6 == L'#') || (XVar6 == L'?')) break;
        bVar2 = XMLString::isAlphaNum(XVar6);
        if ((!bVar2) &&
           (iVar3 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,XVar6), iVar3 == -1)) {
          uStack_3e = 0;
          local_40 = XVar6;
          this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3ba,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,&local_40,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00253c0c;
        }
      }
      uVar12 = uVar12 + 1;
      uVar9 = uVar4;
    } while (uVar4 != uVar12);
  }
  if (this->fPath != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar9 * 2 + 2);
  this->fPath = (XMLCh *)CONCAT44(extraout_var,iVar3);
  XMLString::subString((XMLCh *)CONCAT44(extraout_var,iVar3),uriSpec,0,uVar9,this->fMemoryManager);
  if (XVar6 == L'?') {
    uVar12 = uVar9 + 1;
    XVar6 = L'?';
    uVar9 = uVar12;
    if (uVar12 < uVar4) {
      local_38 = 2 - uVar10;
      uVar8 = uVar12;
      do {
        XVar6 = uriSpec[uVar8];
        if (XVar6 == L'%') {
          if (uVar4 <= uVar8 + 2) {
            uStack_3e = 0;
            local_3c = L'\0';
            memcpy(&local_40,uriSpec + uVar8,(ulong)(uVar8 + 1 < uVar4) * 2 + 2);
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x3e3,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,
                       &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
          bVar2 = XMLString::isHex(uriSpec[uVar8 + 1]);
          if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[uVar8 + 2]), !bVar2)) {
            local_3c = uriSpec[uVar8 + 2];
            local_40 = (XMLCh)*(undefined4 *)(uriSpec + uVar8);
            uStack_3e = (undefined2)((uint)*(undefined4 *)(uriSpec + uVar8) >> 0x10);
            local_3a = 0;
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x3ee,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,
                       &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
        }
        else {
          uVar9 = uVar8;
          if (XVar6 == L'#') break;
          bVar2 = XMLString::isAlphaNum(XVar6);
          if ((!bVar2) &&
             (iVar3 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,XVar6), iVar3 == -1))
          {
            uStack_3e = 0;
            local_40 = XVar6;
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x3fa,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_QUERY,&local_40,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
        }
        lVar5 = local_38 + uVar8;
        uVar8 = uVar8 + 1;
        uVar9 = uVar4;
      } while (lVar5 != 0);
    }
    if (this->fQueryString != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(uVar9 - uVar12) * 2 + 2);
    this->fQueryString = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    XMLString::subString
              ((XMLCh *)CONCAT44(extraout_var_00,iVar3),uriSpec,uVar12,uVar9,this->fMemoryManager);
  }
  if (XVar6 == L'#') {
    uVar12 = uVar9 + 1;
    uVar8 = uVar12;
    if (uVar12 < uVar4) {
      uVar9 = uVar9 + 3;
      do {
        XVar6 = uriSpec[uVar9 - 2];
        if (XVar6 == L'%') {
          if (uVar4 <= uVar9) {
            uStack_3e = 0;
            local_3c = L'\0';
            memcpy(&local_40,uriSpec + (uVar9 - 2),(ulong)(uVar9 - 1 < uVar4) * 2 + 2);
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x420,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                       &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
          bVar2 = XMLString::isHex(uriSpec[uVar9 - 1]);
          if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[uVar9]), !bVar2)) {
            local_3c = uriSpec[uVar9];
            local_40 = (XMLCh)*(undefined4 *)(uriSpec + (uVar9 - 2));
            uStack_3e = (undefined2)((uint)*(undefined4 *)(uriSpec + (uVar9 - 2)) >> 0x10);
            local_3a = 0;
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x42b,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                       &local_40,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
        }
        else {
          bVar2 = XMLString::isAlphaNum(XVar6);
          if ((!bVar2) &&
             (iVar3 = XMLString::indexOf((XMLCh *)MARK_OR_RESERVED_CHARACTERS,XVar6), iVar3 == -1))
          {
            uStack_3e = 0;
            local_40 = XVar6;
            this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x437,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_FRAGMENT,&local_40,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00253c0c;
          }
        }
        bVar2 = uVar9 != uVar10;
        uVar8 = uVar4;
        uVar9 = uVar9 + 1;
      } while (bVar2);
    }
    if (this->fFragment != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (uVar12 <= uVar8 && uVar8 - uVar12 != 0) {
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(uVar8 - uVar12) * 2 + 2);
      this->fFragment = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
      XMLString::subString
                ((XMLCh *)CONCAT44(extraout_var_01,iVar3),uriSpec,uVar12,uVar8,this->fMemoryManager)
      ;
      return;
    }
    this->fFragment = (XMLCh *)0x0;
  }
  return;
}

Assistant:

void XMLUri::initializePath(const XMLCh* const uriSpec)
{
    if ( !uriSpec )
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

    XMLSize_t index = 0;
    XMLSize_t start = 0;
    XMLSize_t end = XMLString::stringLen(uriSpec);
    XMLCh testChar = 0;

    // path - everything up to query string or fragment
    if (start < end)
    {
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        if (!getScheme() || uriSpec[start] == chForwardSlash)
        {
            // Scan path.
            // abs_path = "/"  path_segments
            // rel_path = rel_segment [ abs_path ]
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                else if (!isUnreservedCharacter(testChar) &&
                         !isPathCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
        else
        {
            // Scan opaque part.
            // opaque_part = uric_no_slash *uric
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                // If the scheme specific part is opaque, it can contain '['
                // and ']'. uric_no_slash wasn't modified by RFC 2732, which
                // I've interpreted as an error in the spec, since the
                // production should be equivalent to (uric - '/'), and uric
                // contains '[' and ']'.
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
    } //if (start < end)

    if (getPath())
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
    }

    fPath = (XMLCh*) fMemoryManager->allocate((index+1) * sizeof(XMLCh));//new XMLCh[index+1];
    XMLString::subString(fPath, uriSpec, start, index, fMemoryManager);

    // query - starts with ? and up to fragment or end
    if (testChar == chQuestion)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];
            if (testChar == chPound)
            {
                break;
            }

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_QUERY
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
            }
            index++;
        }

        if (getQueryString())
        {
            fMemoryManager->deallocate(fQueryString);//delete [] fQueryString;
        }

        fQueryString = (XMLCh*) fMemoryManager->allocate
        (
            (index - start + 1) * sizeof(XMLCh)
        );//new XMLCh[index - start + 1];
        XMLString::subString(fQueryString, uriSpec, start, index, fMemoryManager);
    }

    // fragment - starts with #
    if (testChar == chPound)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_FRAGMENT
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
            }

            index++;

        }

        if (getFragment())
            fMemoryManager->deallocate(fFragment);//delete [] fFragment;

        //make sure that there is something following the '#'
        if (index > start)
        {
            fFragment = (XMLCh*) fMemoryManager->allocate
            (
                (index - start + 1) * sizeof(XMLCh)
            );//new XMLCh[index - start + 1];
            XMLString::subString(fFragment, uriSpec, start, index, fMemoryManager);
        }
        else
        {
            // RFC 2396, 4.0. URI Reference
            // URI-reference = [absoulteURI | relativeURI] [# fragment]
            //
            // RFC 2396, 4.1. Fragment Identifier
            // fragment = *uric
            //
            // empty fragment is valid
            fFragment = 0;
        }
    }

}